

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O0

void printStack<std::__cxx11::string>
               (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *stack)

{
  bool bVar1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_50 [8];
  string top;
  string output;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *stack_local;
  
  std::__cxx11::string::string((string *)(top.field_2._M_local_buf + 8));
  while( true ) {
    bVar1 = std::
            stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(stack);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pvVar2 = std::
             stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::top(stack);
    std::__cxx11::string::string((string *)local_50,(string *)pvVar2);
    std::operator+(&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&top.field_2 + 8));
    std::__cxx11::string::operator=((string *)(top.field_2._M_local_buf + 8),(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop(stack);
    bVar1 = std::
            stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(stack);
    if (!bVar1) {
      std::operator+(&local_a0,", ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&top.field_2 + 8));
      std::__cxx11::string::operator=((string *)(top.field_2._M_local_buf + 8),(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  std::operator<<((ostream *)&std::cout,(string *)(top.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(top.field_2._M_local_buf + 8));
  return;
}

Assistant:

void printStack(std::stack<T> stack) {
    std::string output;
//    int initSize = stack.size();
    while (!stack.empty()) {
        std::string top = stack.top();
        output = top + output;
        stack.pop();
        if (!stack.empty()) {
            output = ", " + output;
        }

    }
    std::cout << output;
}